

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<char_const(&)[58],kj::StringPtr,char_const(&)[67],kj::StringPtr,char_const(&)[94]>
          (String *__return_storage_ptr__,kj *this,char (*params) [58],StringPtr *params_1,
          char (*params_2) [67],StringPtr *params_3,char (*params_4) [94])

{
  char (*value) [58];
  StringPtr *pSVar1;
  char (*value_00) [67];
  char (*value_01) [94];
  String *params_4_00;
  ArrayPtr<const_char> local_88;
  ArrayPtr<const_char> local_78;
  ArrayPtr<const_char> local_68;
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  StringPtr *local_38;
  char (*params_local_4) [94];
  StringPtr *params_local_3;
  char (*params_local_2) [67];
  StringPtr *params_local_1;
  char (*params_local) [58];
  
  params_4_00 = __return_storage_ptr__;
  local_38 = params_3;
  params_local_4 = (char (*) [94])params_2;
  params_local_3 = params_1;
  params_local_2 = (char (*) [67])params;
  params_local_1 = (StringPtr *)this;
  params_local = (char (*) [58])__return_storage_ptr__;
  value = ::const((char (*) [58])this);
  local_48 = toCharSequence<char_const(&)[58]>(value);
  pSVar1 = fwd<kj::StringPtr>((NoInfer<kj::StringPtr> *)params_local_2);
  local_58 = toCharSequence<kj::StringPtr>(pSVar1);
  value_00 = ::const((char (*) [67])params_local_3);
  local_68 = toCharSequence<char_const(&)[67]>(value_00);
  pSVar1 = fwd<kj::StringPtr>((NoInfer<kj::StringPtr> *)params_local_4);
  local_78 = toCharSequence<kj::StringPtr>(pSVar1);
  value_01 = ::const((char (*) [94])local_38);
  local_88 = toCharSequence<char_const(&)[94]>(value_01);
  _::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (params_4_00,(_ *)&local_48,&local_58,&local_68,&local_78,&local_88,
             (ArrayPtr<const_char> *)params_4_00);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}